

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::LineGeometry::LineGeometry
          (LineGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  Scope *sc;
  Element *el;
  Element *el_00;
  allocator<char> local_51;
  string local_50;
  
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__LineGeometry_007f88d0;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sc = (element->compound)._M_t.
       super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
       super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  if (sc != (Scope *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Points",&local_51);
    el = GetRequiredElement(sc,&local_50,element);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"PointsIndex",&local_51);
    el_00 = GetRequiredElement(sc,&local_50,element);
    std::__cxx11::string::~string((string *)&local_50);
    ParseVectorDataArray(&this->m_vertices,el);
    ParseVectorDataArray(&this->m_indices,el_00);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"failed to read Geometry object (class: Line), no data scope found"
             ,&local_51);
  Util::DOMError(&local_50,(Element *)0x0);
}

Assistant:

LineGeometry::LineGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
    : Geometry(id, element, name, doc)
{
    const Scope* sc = element.Compound();
    if (!sc) {
        DOMError("failed to read Geometry object (class: Line), no data scope found");
    }
    const Element& Points = GetRequiredElement(*sc, "Points", &element);
    const Element& PointsIndex = GetRequiredElement(*sc, "PointsIndex", &element);
    ParseVectorDataArray(m_vertices, Points);
    ParseVectorDataArray(m_indices, PointsIndex);
}